

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_ubyte(uchar value)

{
  undefined4 *puVar1;
  AMQP_VALUE pAVar2;
  
  puVar1 = (undefined4 *)malloc(0x20);
  if (puVar1 == (undefined4 *)0x0) {
    pAVar2 = (AMQP_VALUE)0x0;
  }
  else {
    pAVar2 = (AMQP_VALUE)(puVar1 + 2);
    *puVar1 = 1;
    puVar1[2] = 3;
    *(uchar *)(puVar1 + 4) = value;
  }
  return pAVar2;
}

Assistant:

AMQP_VALUE amqpvalue_create_ubyte(unsigned char value)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result != NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_032: [amqpvalue_create_ubyte shall return a handle to an AMQP_VALUE that stores a unsigned char value.] */
        result->type = AMQP_TYPE_UBYTE;
        result->value.ubyte_value = value;
    }

    return result;
}